

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O0

elem * __thiscall cilkred_map::lookup(cilkred_map *this,void *key)

{
  bucket **ppbVar1;
  size_t sVar2;
  void *in_RSI;
  cilkred_map *in_RDI;
  elem *el;
  bucket *b;
  elem *local_28;
  
  ppbVar1 = in_RDI->buckets;
  sVar2 = hashfun(in_RDI,in_RSI);
  if (ppbVar1[sVar2] != (bucket *)0x0) {
    for (local_28 = ppbVar1[sVar2]->el; local_28->key != (void *)0x0; local_28 = local_28 + 1) {
      if (local_28->key == in_RSI) {
        if (local_28->view != (void *)0x0) {
          return local_28;
        }
        __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/reducer_impl.cpp"
                      ,0x20a,"el->view");
      }
    }
  }
  return (elem *)0x0;
}

Assistant:

elem *cilkred_map::lookup(void *key)
{
    bucket *b = buckets[hashfun(this, key)];

    if (b) {
        elem *el;
        for (el = b->el; el->key; ++el) {
            if (el->key == key) {
                CILK_ASSERT(el->view);
                return el;
            }
        }
    }

    return 0;
}